

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

void * dja::mat4::memcpy(void *__dest,void *__src,size_t __n)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  
  uVar1 = *__src;
  uVar21 = *(undefined4 *)((long)__src + 4);
  uVar16 = *(undefined4 *)((long)__src + 8);
  uVar17 = *(undefined4 *)((long)__src + 0xc);
  uVar2 = *(undefined4 *)((long)__src + 0x10);
  uVar3 = *(undefined4 *)((long)__src + 0x14);
  uVar22 = *(undefined4 *)((long)__src + 0x18);
  uVar15 = *(undefined4 *)((long)__src + 0x1c);
  uVar4 = *(undefined4 *)((long)__src + 0x20);
  uVar5 = *(undefined4 *)((long)__src + 0x24);
  uVar6 = *(undefined4 *)((long)__src + 0x28);
  uVar20 = *(undefined4 *)((long)__src + 0x2c);
  uVar7 = *(undefined4 *)((long)__src + 0x30);
  uVar8 = *(undefined4 *)((long)__src + 0x34);
  uVar9 = *(undefined4 *)((long)__src + 0x38);
  uVar10 = *(undefined4 *)((long)__src + 0x3c);
  uVar11 = uVar7;
  uVar12 = uVar4;
  uVar13 = uVar8;
  uVar14 = uVar9;
  uVar18 = uVar2;
  uVar19 = uVar5;
  if ((int)__n == 0) {
    *(undefined8 *)((long)__dest + 0x30) = 0;
    *(undefined8 *)((long)__dest + 0x38) = 0;
    *(undefined8 *)((long)__dest + 0x20) = 0;
    *(undefined8 *)((long)__dest + 0x28) = 0;
    *(undefined8 *)((long)__dest + 0x10) = 0;
    *(undefined8 *)((long)__dest + 0x18) = 0;
    *(undefined8 *)__dest = 0;
    *(undefined8 *)((long)__dest + 8) = 0;
    uVar11 = uVar17;
    uVar12 = uVar16;
    uVar13 = uVar15;
    uVar14 = uVar20;
    uVar15 = uVar8;
    uVar16 = uVar4;
    uVar17 = uVar7;
    uVar18 = uVar21;
    uVar19 = uVar22;
    uVar20 = uVar9;
    uVar21 = uVar2;
    uVar22 = uVar5;
  }
  *(undefined4 *)__dest = uVar1;
  *(undefined4 *)((long)__dest + 4) = uVar21;
  *(undefined4 *)((long)__dest + 8) = uVar16;
  *(undefined4 *)((long)__dest + 0xc) = uVar17;
  *(undefined4 *)((long)__dest + 0x10) = uVar18;
  *(undefined4 *)((long)__dest + 0x14) = uVar3;
  *(undefined4 *)((long)__dest + 0x18) = uVar22;
  *(undefined4 *)((long)__dest + 0x1c) = uVar15;
  *(undefined4 *)((long)__dest + 0x20) = uVar12;
  *(undefined4 *)((long)__dest + 0x24) = uVar19;
  *(undefined4 *)((long)__dest + 0x28) = uVar6;
  *(undefined4 *)((long)__dest + 0x2c) = uVar20;
  *(undefined4 *)((long)__dest + 0x30) = uVar11;
  *(undefined4 *)((long)__dest + 0x34) = uVar13;
  *(undefined4 *)((long)__dest + 0x38) = uVar14;
  *(undefined4 *)((long)__dest + 0x3c) = uVar10;
  return __dest;
}

Assistant:

mat4 mat4::memcpy(const float_t *v, bool rowmajor)
{
    mat4 m;
    std::memcpy(&m[0][0], v, sizeof(mat4));
    return rowmajor ? m : transpose(m);
}